

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen_presplit.h
# Opt level: O3

void embree::avx::splitPrimitive<embree::avx::QuadSplitter>
               (QuadSplitter *splitter,PrimRef *prim,uint splitprims,SplittingGrid *grid,
               PrimRef *subPrims,uint *numSubPrims)

{
  PrimRef *pPVar1;
  float fVar2;
  float fVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  uint uVar7;
  float fVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  uint uVar12;
  ulong uVar13;
  byte bVar14;
  long lVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  PrimRef left;
  PrimRef right;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_a0;
  undefined1 local_90 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_80;
  undefined1 local_70 [16];
  undefined1 auVar18 [64];
  undefined1 auVar20 [64];
  
  if (splitprims == 1) {
    uVar7 = *numSubPrims;
    *numSubPrims = uVar7 + 1;
    uVar9 = *(undefined8 *)((long)&(prim->lower).field_0 + 8);
    uVar10 = *(undefined8 *)&(prim->upper).field_0;
    uVar11 = *(undefined8 *)((long)&(prim->upper).field_0 + 8);
    pPVar1 = subPrims + uVar7;
    *(undefined8 *)&(pPVar1->lower).field_0 = *(undefined8 *)&(prim->lower).field_0;
    *(undefined8 *)((long)&(pPVar1->lower).field_0 + 8) = uVar9;
    *(undefined8 *)&(pPVar1->upper).field_0 = uVar10;
    *(undefined8 *)((long)&(pPVar1->upper).field_0 + 8) = uVar11;
    return;
  }
  aVar4 = (prim->lower).field_0;
  aVar5 = (prim->upper).field_0;
  aVar6 = (grid->base).field_0;
  auVar17 = vsubps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar6);
  fVar2 = grid->scale;
  auVar21._0_4_ = auVar17._0_4_ * fVar2 + 0.2;
  auVar21._4_4_ = auVar17._4_4_ * fVar2 + 0.2;
  auVar21._8_4_ = auVar17._8_4_ * fVar2 + 0.2;
  auVar21._12_4_ = auVar17._12_4_ * fVar2 + 0.2;
  auVar17 = vsubps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar6);
  auVar27._0_4_ = auVar17._0_4_ * fVar2 + -0.2;
  auVar27._4_4_ = auVar17._4_4_ * fVar2 + -0.2;
  auVar27._8_4_ = auVar17._8_4_ * fVar2 + -0.2;
  auVar27._12_4_ = auVar17._12_4_ * fVar2 + -0.2;
  auVar17 = vroundps_avx(auVar21,1);
  auVar17 = vcvtps2dq_avx(auVar17);
  auVar19 = vroundps_avx(auVar27,1);
  auVar19 = vcvtps2dq_avx(auVar19);
  auVar21 = vcvtps2dq_avx(auVar21);
  auVar27 = vcvtps2dq_avx(auVar27);
  auVar21 = vpcmpgtd_avx(auVar27,auVar21);
  local_a0 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vblendvps_avx(auVar17,auVar19,auVar21);
  auVar19 = vshufps_avx(auVar17,auVar17,0xe8);
  auVar21 = vpslld_avx(auVar19,0x10);
  auVar19 = vpor_avx(auVar21,auVar19);
  auVar22._8_4_ = 0x30000ff;
  auVar22._0_8_ = 0x30000ff030000ff;
  auVar22._12_4_ = 0x30000ff;
  auVar19 = vpand_avx(auVar19,auVar22);
  auVar21 = vpslld_avx(auVar19,8);
  auVar19 = vpor_avx(auVar19,auVar21);
  auVar24._8_4_ = 0x300f00f;
  auVar24._0_8_ = 0x300f00f0300f00f;
  auVar24._12_4_ = 0x300f00f;
  auVar19 = vpand_avx(auVar19,auVar24);
  auVar21 = vpslld_avx(auVar19,4);
  auVar19 = vpor_avx(auVar19,auVar21);
  auVar26._8_4_ = 0x30c30c3;
  auVar26._0_8_ = 0x30c30c3030c30c3;
  auVar26._12_4_ = 0x30c30c3;
  auVar19 = vpand_avx(auVar19,auVar26);
  auVar19 = vpmulld_avx(auVar19,_DAT_01fb7070);
  auVar19 = vpand_avx(auVar19,_DAT_01fb7080);
  auVar21 = vshufps_avx((undefined1  [16])local_a0,(undefined1  [16])local_a0,0xe9);
  auVar27 = vpslld_avx(auVar21,0x10);
  auVar21 = vpor_avx(auVar27,auVar21);
  auVar21 = vpand_avx(auVar21,auVar22);
  auVar27 = vpslld_avx(auVar21,8);
  auVar21 = vpor_avx(auVar21,auVar27);
  auVar21 = vpand_avx(auVar21,auVar24);
  auVar27 = vpslld_avx(auVar21,4);
  auVar21 = vpor_avx(auVar21,auVar27);
  auVar21 = vpand_avx(auVar21,auVar26);
  auVar21 = vpmulld_avx(auVar21,_DAT_01fb7090);
  auVar21 = vpand_avx(auVar21,_DAT_01fb70a0);
  auVar17 = vblendps_avx((undefined1  [16])local_a0,auVar17,2);
  auVar17 = vshufps_avx(auVar17,auVar17,0xe1);
  auVar27 = vpslld_avx(auVar17,0x10);
  auVar17 = vpor_avx(auVar27,auVar17);
  auVar17 = vpand_avx(auVar17,auVar22);
  auVar27 = vpslld_avx(auVar17,8);
  auVar17 = vpor_avx(auVar17,auVar27);
  auVar17 = vpand_avx(auVar17,auVar24);
  auVar27 = vpslld_avx(auVar17,4);
  auVar17 = vpor_avx(auVar17,auVar27);
  auVar17 = vpand_avx(auVar17,auVar26);
  auVar17 = vpmulld_avx(auVar17,_DAT_01fb70b0);
  auVar17 = vpand_avx(auVar17,_DAT_01fb70c0);
  auVar27 = vpunpckldq_avx(auVar19,auVar21);
  auVar27 = vpor_avx(auVar27,auVar17);
  auVar17 = vpshufd_avx(auVar19,0x55);
  auVar17 = vpblendw_avx(auVar17,auVar21,0xc);
  auVar17 = vpor_avx(auVar27,auVar17);
  if (auVar17._0_4_ == auVar17._4_4_) {
    uVar7 = *numSubPrims;
    *numSubPrims = uVar7 + 1;
    uVar9 = *(undefined8 *)((long)&(prim->lower).field_0 + 8);
    uVar10 = *(undefined8 *)&(prim->upper).field_0;
    uVar11 = *(undefined8 *)((long)&(prim->upper).field_0 + 8);
    pPVar1 = subPrims + uVar7;
    *(undefined8 *)&(pPVar1->lower).field_0 = *(undefined8 *)&(prim->lower).field_0;
    *(undefined8 *)((long)&(pPVar1->lower).field_0 + 8) = uVar9;
    *(undefined8 *)&(pPVar1->upper).field_0 = uVar10;
    *(undefined8 *)((long)&(pPVar1->upper).field_0 + 8) = uVar11;
  }
  else {
    uVar12 = auVar17._4_4_ ^ auVar17._0_4_;
    uVar7 = 0x1f;
    if (uVar12 != 0) {
      for (; uVar12 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar16 = (ulong)uVar7;
    uVar13 = (ulong)(uVar7 % 3 << 2);
    bVar14 = (byte)(uVar16 / 3);
    fVar8 = (float)((*(uint *)((long)&local_a0 + uVar13) >> (bVar14 & 0x1f)) << (bVar14 & 0x1f)) *
            0.0009765625 * grid->extend + *(float *)((long)&(grid->base).field_0 + uVar13);
    auVar17._8_4_ = 0x7f800000;
    auVar17._0_8_ = 0x7f8000007f800000;
    auVar17._12_4_ = 0x7f800000;
    auVar18 = ZEXT1664(auVar17);
    auVar19._8_4_ = 0xff800000;
    auVar19._0_8_ = 0xff800000ff800000;
    auVar19._12_4_ = 0xff800000;
    auVar20 = ZEXT1664(auVar19);
    lVar15 = 0;
    auVar23 = ZEXT1664(auVar19);
    auVar25 = ZEXT1664(auVar17);
    fVar2 = *(float *)((long)&splitter->v[0].field_0 + uVar13);
    do {
      if (fVar2 <= fVar8) {
        auVar17 = *(undefined1 (*) [16])((long)&splitter->v[0].field_0 + lVar15);
        auVar19 = vminps_avx(auVar18._0_16_,auVar17);
        auVar18 = ZEXT1664(auVar19);
        auVar17 = vmaxps_avx(auVar20._0_16_,auVar17);
        auVar20 = ZEXT1664(auVar17);
      }
      if (fVar8 <= fVar2) {
        auVar17 = *(undefined1 (*) [16])((long)&splitter->v[0].field_0 + lVar15);
        auVar19 = vminps_avx(auVar25._0_16_,auVar17);
        auVar25 = ZEXT1664(auVar19);
        auVar17 = vmaxps_avx(auVar23._0_16_,auVar17);
        auVar23 = ZEXT1664(auVar17);
      }
      fVar3 = *(float *)((long)splitter + lVar15 + uVar16 * 4 + (uVar16 / 3) * -0xc + 0x10);
      if (((fVar2 < fVar8) && (fVar8 < fVar3)) || ((fVar8 < fVar2 && (fVar3 < fVar8)))) {
        auVar17 = ZEXT416((uint)((fVar8 - fVar2) * (1.0 / (fVar3 - fVar2))));
        auVar19 = vshufps_avx(auVar17,auVar17,0);
        auVar17 = *(undefined1 (*) [16])((long)&splitter->v[0].field_0 + lVar15);
        auVar21 = vsubps_avx(*(undefined1 (*) [16])((long)&splitter->v[1].field_0 + lVar15),auVar17)
        ;
        auVar28._0_4_ = auVar17._0_4_ + auVar19._0_4_ * auVar21._0_4_;
        auVar28._4_4_ = auVar17._4_4_ + auVar19._4_4_ * auVar21._4_4_;
        auVar28._8_4_ = auVar17._8_4_ + auVar19._8_4_ * auVar21._8_4_;
        auVar28._12_4_ = auVar17._12_4_ + auVar19._12_4_ * auVar21._12_4_;
        auVar17 = vminps_avx(auVar18._0_16_,auVar28);
        auVar18 = ZEXT1664(auVar17);
        auVar17 = vmaxps_avx(auVar20._0_16_,auVar28);
        auVar20 = ZEXT1664(auVar17);
        auVar17 = vminps_avx(auVar25._0_16_,auVar28);
        auVar25 = ZEXT1664(auVar17);
        auVar17 = vmaxps_avx(auVar23._0_16_,auVar28);
        auVar23 = ZEXT1664(auVar17);
      }
      lVar15 = lVar15 + 0x10;
      fVar2 = fVar3;
    } while (lVar15 != 0x50);
    auVar17 = vmaxps_avx(auVar18._0_16_,(undefined1  [16])aVar4);
    auVar19 = vminps_avx(auVar20._0_16_,(undefined1  [16])aVar5);
    local_a0.m128 = (__m128)vblendps_avx(auVar17,aVar4.m128,8);
    local_90 = vblendps_avx(auVar19,(undefined1  [16])aVar5,8);
    auVar17 = vmaxps_avx(auVar25._0_16_,(undefined1  [16])aVar4);
    auVar19 = vminps_avx(auVar23._0_16_,(undefined1  [16])aVar5);
    local_80.m128 = (__m128)vblendps_avx(auVar17,aVar4.m128,8);
    local_70 = vblendps_avx(auVar19,(undefined1  [16])aVar5,8);
    splitPrimitive<embree::avx::QuadSplitter>
              (splitter,(PrimRef *)&local_a0.field_1,splitprims >> 1,grid,subPrims,numSubPrims);
    splitPrimitive<embree::avx::QuadSplitter>
              (splitter,(PrimRef *)&local_80.field_1,splitprims - (splitprims >> 1),grid,subPrims,
               numSubPrims);
  }
  return;
}

Assistant:

void splitPrimitive(const Splitter& splitter,
                          const PrimRef& prim,
                          const unsigned int splitprims,
                          const SplittingGrid& grid,
                          PrimRef subPrims[MAX_PRESPLITS_PER_PRIMITIVE],
                          unsigned int& numSubPrims)
    {
      assert(splitprims > 0 && splitprims <= MAX_PRESPLITS_PER_PRIMITIVE);
      
      if (splitprims == 1)
      {
        assert(numSubPrims < MAX_PRESPLITS_PER_PRIMITIVE);
        subPrims[numSubPrims++] = prim;
      }
      else
      {
        unsigned int dim; float fsplit;
        if (!grid.split_pos(prim, dim, fsplit))
        {
          assert(numSubPrims < MAX_PRESPLITS_PER_PRIMITIVE);
          subPrims[numSubPrims++] = prim;
          return;
        }
          
        /* split primitive */
        PrimRef left,right;
        splitter(prim,dim,fsplit,left,right);
        assert(!left.bounds().empty());
        assert(!right.bounds().empty());

        const unsigned int splitprims_left = splitprims/2;
        const unsigned int splitprims_right = splitprims - splitprims_left;
        splitPrimitive(splitter,left,splitprims_left,grid,subPrims,numSubPrims);
        splitPrimitive(splitter,right,splitprims_right,grid,subPrims,numSubPrims);
      }
    }